

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  _func_int **pp_Var3;
  int q_1;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  undefined1 (*pauVar12) [32];
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int q;
  long lVar18;
  long lVar19;
  int iVar20;
  _func_int *p_Var21;
  float *beta;
  uint *puVar22;
  long lVar23;
  ulong uVar24;
  float *gamma;
  undefined1 (*pauVar25) [32];
  float fVar26;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar35 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 in_ZMM11 [64];
  
  iVar20 = bottom_top_blob->dims;
  pp_Var1 = this->_vptr_GroupNorm_x86_fma;
  p_Var21 = pp_Var1[-3];
  iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var21);
  uVar8 = (long)*(int *)(&this->field_0xd4 + (long)p_Var21) / (long)iVar13;
  iVar4 = (int)uVar8;
  lVar5 = (long)iVar4;
  if (iVar20 == 2) {
    iVar20 = bottom_top_blob->w;
    iVar9 = iVar20 * iVar4;
    lVar6 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (lVar10 = 0; lVar10 < iVar13; lVar10 = lVar10 + 1) {
      lVar14 = lVar10 * lVar5;
      pvVar2 = bottom_top_blob->data;
      pauVar25 = (undefined1 (*) [32])
                 (lVar14 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar2);
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar26 = 0.0;
      fVar36 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      lVar18 = 0;
      pauVar12 = pauVar25;
      for (iVar13 = 0; iVar13 + 7 < iVar9; iVar13 = iVar13 + 8) {
        fVar26 = fVar26 + *(float *)*pauVar12;
        fVar36 = fVar36 + *(float *)(*pauVar12 + 4);
        fVar37 = fVar37 + *(float *)(*pauVar12 + 8);
        fVar38 = fVar38 + *(float *)(*pauVar12 + 0xc);
        fVar39 = fVar39 + *(float *)(*pauVar12 + 0x10);
        fVar40 = fVar40 + *(float *)(*pauVar12 + 0x14);
        fVar41 = fVar41 + *(float *)(*pauVar12 + 0x18);
        fVar42 = fVar42 + *(float *)(*pauVar12 + 0x1c);
        pauVar12 = pauVar12 + 1;
        lVar18 = lVar18 + 8;
      }
      pfVar11 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var21) +
                         *(long *)(&this->field_0xf0 + (long)p_Var21) * lVar14);
      auVar30._0_4_ = fVar39 + fVar26;
      auVar30._4_4_ = fVar40 + fVar36;
      auVar30._8_4_ = fVar41 + fVar37;
      auVar30._12_4_ = fVar42 + fVar38;
      auVar34 = vshufpd_avx(auVar30,auVar30,1);
      auVar31._0_4_ = auVar34._0_4_ + auVar30._0_4_;
      auVar31._4_4_ = auVar34._4_4_ + auVar30._4_4_;
      auVar31._8_4_ = auVar34._8_4_ + auVar30._8_4_;
      auVar31._12_4_ = auVar34._12_4_ + auVar30._12_4_;
      auVar34 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar37 = auVar34._4_4_;
        fVar38 = auVar34._8_4_;
        fVar26 = auVar34._12_4_;
        if (iVar9 <= iVar13 + 3) break;
        auVar34._0_4_ = auVar34._0_4_ + *(float *)*pauVar12;
        auVar34._4_4_ = fVar37 + *(float *)(*pauVar12 + 4);
        auVar34._8_4_ = fVar38 + *(float *)(*pauVar12 + 8);
        auVar34._12_4_ = fVar26 + *(float *)(*pauVar12 + 0xc);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        iVar13 = iVar13 + 4;
        lVar18 = lVar18 + 4;
      }
      auVar30 = vshufpd_avx(auVar34,auVar34,1);
      auVar33._0_4_ = auVar30._0_4_ + auVar34._0_4_;
      auVar33._4_4_ = auVar30._4_4_ + fVar37;
      auVar33._8_4_ = auVar30._8_4_ + fVar38;
      auVar33._12_4_ = auVar30._12_4_ + fVar26;
      auVar30 = vmovshdup_avx(auVar33);
      auVar34 = vhaddps_avx(auVar31,auVar31);
      fVar37 = auVar34._0_4_ + auVar30._0_4_ + auVar33._0_4_;
      lVar15 = bottom_top_blob->elemsize * lVar6 * (long)bottom_top_blob->w;
      for (; (int)lVar18 < iVar9; lVar18 = lVar18 + 1) {
        fVar37 = fVar37 + *(float *)((long)pvVar2 + lVar18 * 4 + lVar15);
      }
      fVar37 = fVar37 * (1.0 / (float)iVar9);
      auVar34 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
      auVar56._16_16_ = auVar34;
      auVar56._0_16_ = auVar34;
      lVar18 = 0;
      auVar30 = ZEXT816(0) << 0x20;
      pauVar12 = pauVar25;
      for (iVar13 = 0; iVar13 + 7 < iVar9; iVar13 = iVar13 + 8) {
        auVar61 = vsubps_avx(*pauVar12,auVar56);
        auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar61,auVar61);
        pauVar12 = pauVar12 + 1;
        lVar18 = lVar18 + 8;
      }
      auVar51._0_4_ = auVar30._0_4_ + 0.0;
      auVar51._4_4_ = auVar30._4_4_ + 0.0;
      auVar51._8_4_ = auVar30._8_4_ + 0.0;
      auVar51._12_4_ = auVar30._12_4_ + 0.0;
      auVar30 = vshufpd_avx(auVar51,auVar51,1);
      auVar52._0_4_ = auVar30._0_4_ + auVar51._0_4_;
      auVar52._4_4_ = auVar30._4_4_ + auVar51._4_4_;
      auVar52._8_4_ = auVar30._8_4_ + auVar51._8_4_;
      auVar52._12_4_ = auVar30._12_4_ + auVar51._12_4_;
      auVar30 = ZEXT816(0) << 0x40;
      for (; iVar13 + 3 < iVar9; iVar13 = iVar13 + 4) {
        auVar31 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar34);
        auVar30 = vfmadd231ps_fma(auVar30,auVar31,auVar31);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        lVar18 = lVar18 + 4;
      }
      auVar31 = vshufpd_avx(auVar30,auVar30,1);
      auVar34 = vhaddps_avx(auVar52,auVar52);
      auVar32._0_4_ = auVar31._0_4_ + auVar30._0_4_;
      auVar32._4_4_ = auVar31._4_4_ + auVar30._4_4_;
      auVar32._8_4_ = auVar31._8_4_ + auVar30._8_4_;
      auVar32._12_4_ = auVar31._12_4_ + auVar30._12_4_;
      auVar30 = vmovshdup_avx(auVar32);
      auVar35 = ZEXT464((uint)(auVar34._0_4_ + auVar30._0_4_ + auVar32._0_4_));
      for (; (int)lVar18 < iVar9; lVar18 = lVar18 + 1) {
        auVar34 = ZEXT416((uint)(*(float *)((long)pvVar2 + lVar18 * 4 + lVar15) - fVar37));
        auVar34 = vfmadd231ss_fma(auVar35._0_16_,auVar34,auVar34);
        auVar35 = ZEXT1664(auVar34);
      }
      auVar30 = vfmadd213ss_fma(auVar35._0_16_,ZEXT416((uint)(1.0 / (float)iVar9)),
                                ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var21)));
      auVar34 = vrsqrtss_avx(auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar34._0_4_)),auVar34,
                                SUB6416(ZEXT464(0xc0400000),0));
      fVar38 = auVar34._0_4_ * -0.5 * auVar30._0_4_;
      auVar34 = ZEXT416((uint)(fVar38 * -fVar37));
      if (*(int *)(&this->field_0xdc + (long)p_Var21) == 0) {
        auVar33 = ZEXT416((uint)fVar38);
        auVar30 = vshufps_avx(auVar33,auVar33,0);
        auVar61._16_16_ = auVar30;
        auVar61._0_16_ = auVar30;
        auVar31 = vshufps_avx(auVar34,auVar34,0);
        auVar65._16_16_ = auVar31;
        auVar65._0_16_ = auVar31;
        lVar14 = 0;
        for (iVar13 = 0; iVar13 + 7 < iVar9; iVar13 = iVar13 + 8) {
          auVar51 = vfmadd132ps_fma(*pauVar25,auVar65,auVar61);
          *pauVar25 = ZEXT1632(auVar51);
          pauVar25 = pauVar25 + 1;
          lVar14 = lVar14 + 8;
        }
        for (; iVar13 + 3 < iVar9; iVar13 = iVar13 + 4) {
          auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar31,auVar30);
          *(undefined1 (*) [16])*pauVar25 = auVar51;
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          lVar14 = lVar14 + 4;
        }
        for (; (int)lVar14 < iVar9; lVar14 = lVar14 + 1) {
          auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar2 + lVar14 * 4 + lVar15)),auVar34,
                                    auVar33);
          *(int *)((long)pvVar2 + lVar14 * 4 + lVar15) = auVar30._0_4_;
        }
      }
      else {
        puVar22 = (uint *)(*(long *)(&this->field_0x128 + (long)p_Var21) +
                          lVar14 * *(long *)(&this->field_0x138 + (long)p_Var21));
        for (iVar13 = 0; iVar13 != iVar4; iVar13 = iVar13 + 1) {
          fVar37 = *pfVar11 * fVar38;
          auVar33 = vfmadd213ss_fma(ZEXT416((uint)*pfVar11),auVar34,ZEXT416(*puVar22));
          auVar30 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
          auVar67._16_16_ = auVar30;
          auVar67._0_16_ = auVar30;
          auVar31 = vshufps_avx(auVar33,auVar33,0);
          auVar69._16_16_ = auVar31;
          auVar69._0_16_ = auVar31;
          for (iVar16 = 0; iVar16 + 7 < iVar20; iVar16 = iVar16 + 8) {
            auVar51 = vfmadd132ps_fma(*pauVar25,auVar69,auVar67);
            *pauVar25 = ZEXT1632(auVar51);
            pauVar25 = pauVar25 + 1;
          }
          for (; iVar16 + 3 < iVar20; iVar16 = iVar16 + 4) {
            auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar31,auVar30);
            *(undefined1 (*) [16])*pauVar25 = auVar51;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          }
          for (; iVar16 < iVar20; iVar16 = iVar16 + 1) {
            auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar25),auVar33,ZEXT416((uint)fVar37));
            *(int *)*pauVar25 = auVar30._0_4_;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 4);
          }
          pfVar11 = pfVar11 + 1;
          puVar22 = puVar22 + 1;
        }
      }
      p_Var21 = pp_Var1[-3];
      iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var21);
      lVar6 = lVar6 + lVar5;
    }
  }
  else if (iVar20 == 1) {
    lVar6 = 0;
    for (lVar10 = 0; lVar10 < iVar13; lVar10 = lVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      pauVar25 = (undefined1 (*) [32])(lVar10 * lVar5 * bottom_top_blob->elemsize + (long)pvVar2);
      lVar14 = 0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar26 = 0.0;
      fVar36 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      pauVar12 = pauVar25;
      for (iVar20 = 0; iVar20 + 7 < iVar4; iVar20 = iVar20 + 8) {
        fVar26 = fVar26 + *(float *)*pauVar12;
        fVar36 = fVar36 + *(float *)(*pauVar12 + 4);
        fVar37 = fVar37 + *(float *)(*pauVar12 + 8);
        fVar38 = fVar38 + *(float *)(*pauVar12 + 0xc);
        fVar39 = fVar39 + *(float *)(*pauVar12 + 0x10);
        fVar40 = fVar40 + *(float *)(*pauVar12 + 0x14);
        fVar41 = fVar41 + *(float *)(*pauVar12 + 0x18);
        fVar42 = fVar42 + *(float *)(*pauVar12 + 0x1c);
        pauVar12 = pauVar12 + 1;
        lVar14 = lVar14 + 8;
      }
      auVar27._0_4_ = fVar39 + fVar26;
      auVar27._4_4_ = fVar40 + fVar36;
      auVar27._8_4_ = fVar41 + fVar37;
      auVar27._12_4_ = fVar42 + fVar38;
      auVar34 = vshufpd_avx(auVar27,auVar27,1);
      auVar28._0_4_ = auVar34._0_4_ + auVar27._0_4_;
      auVar28._4_4_ = auVar34._4_4_ + auVar27._4_4_;
      auVar28._8_4_ = auVar34._8_4_ + auVar27._8_4_;
      auVar28._12_4_ = auVar34._12_4_ + auVar27._12_4_;
      auVar43 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar37 = auVar43._4_4_;
        fVar38 = auVar43._8_4_;
        fVar26 = auVar43._12_4_;
        if (iVar4 <= iVar20 + 3) break;
        auVar43._0_4_ = auVar43._0_4_ + *(float *)*pauVar12;
        auVar43._4_4_ = fVar37 + *(float *)(*pauVar12 + 4);
        auVar43._8_4_ = fVar38 + *(float *)(*pauVar12 + 8);
        auVar43._12_4_ = fVar26 + *(float *)(*pauVar12 + 0xc);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        iVar20 = iVar20 + 4;
        lVar14 = lVar14 + 4;
      }
      auVar34 = vshufpd_avx(auVar43,auVar43,1);
      auVar44._0_4_ = auVar34._0_4_ + auVar43._0_4_;
      auVar44._4_4_ = auVar34._4_4_ + fVar37;
      auVar44._8_4_ = auVar34._8_4_ + fVar38;
      auVar44._12_4_ = auVar34._12_4_ + fVar26;
      auVar30 = vmovshdup_avx(auVar44);
      auVar34 = vhaddps_avx(auVar28,auVar28);
      fVar37 = auVar34._0_4_ + auVar30._0_4_ + auVar44._0_4_;
      lVar18 = bottom_top_blob->elemsize * lVar6;
      for (; (int)lVar14 < iVar4; lVar14 = lVar14 + 1) {
        fVar37 = fVar37 + *(float *)((long)pvVar2 + lVar14 * 4 + lVar18);
      }
      fVar37 = fVar37 * (1.0 / (float)iVar4);
      auVar34 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
      auVar55._16_16_ = auVar34;
      auVar55._0_16_ = auVar34;
      lVar14 = 0;
      auVar30 = ZEXT816(0) << 0x20;
      pauVar12 = pauVar25;
      for (iVar20 = 0; iVar20 + 7 < iVar4; iVar20 = iVar20 + 8) {
        auVar56 = vsubps_avx(*pauVar12,auVar55);
        auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar56,auVar56);
        pauVar12 = pauVar12 + 1;
        lVar14 = lVar14 + 8;
      }
      auVar49._0_4_ = auVar30._0_4_ + 0.0;
      auVar49._4_4_ = auVar30._4_4_ + 0.0;
      auVar49._8_4_ = auVar30._8_4_ + 0.0;
      auVar49._12_4_ = auVar30._12_4_ + 0.0;
      auVar30 = vshufpd_avx(auVar49,auVar49,1);
      auVar50._0_4_ = auVar30._0_4_ + auVar49._0_4_;
      auVar50._4_4_ = auVar30._4_4_ + auVar49._4_4_;
      auVar50._8_4_ = auVar30._8_4_ + auVar49._8_4_;
      auVar50._12_4_ = auVar30._12_4_ + auVar49._12_4_;
      auVar30 = ZEXT816(0) << 0x40;
      for (; iVar20 + 3 < iVar4; iVar20 = iVar20 + 4) {
        auVar31 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar34);
        auVar30 = vfmadd231ps_fma(auVar30,auVar31,auVar31);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        lVar14 = lVar14 + 4;
      }
      auVar31 = vshufpd_avx(auVar30,auVar30,1);
      auVar34 = vhaddps_avx(auVar50,auVar50);
      auVar29._0_4_ = auVar31._0_4_ + auVar30._0_4_;
      auVar29._4_4_ = auVar31._4_4_ + auVar30._4_4_;
      auVar29._8_4_ = auVar31._8_4_ + auVar30._8_4_;
      auVar29._12_4_ = auVar31._12_4_ + auVar30._12_4_;
      auVar30 = vmovshdup_avx(auVar29);
      auVar35 = ZEXT464((uint)(auVar34._0_4_ + auVar30._0_4_ + auVar29._0_4_));
      for (; (int)lVar14 < iVar4; lVar14 = lVar14 + 1) {
        auVar34 = ZEXT416((uint)(*(float *)((long)pvVar2 + lVar14 * 4 + lVar18) - fVar37));
        auVar34 = vfmadd231ss_fma(auVar35._0_16_,auVar34,auVar34);
        auVar35 = ZEXT1664(auVar34);
      }
      auVar30 = vfmadd213ss_fma(auVar35._0_16_,ZEXT416((uint)(1.0 / (float)iVar4)),
                                ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var21)));
      auVar34 = vrsqrtss_avx(auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar34._0_4_)),auVar34,
                                SUB6416(ZEXT464(0xc0400000),0));
      fVar38 = auVar34._0_4_ * -0.5 * auVar30._0_4_;
      auVar34 = ZEXT416((uint)fVar38);
      auVar30 = ZEXT416((uint)(fVar38 * -fVar37));
      if (*(int *)(&this->field_0xdc + (long)p_Var21) == 0) {
        auVar34 = vshufps_avx(auVar34,auVar34,0);
        auVar60._16_16_ = auVar34;
        auVar60._0_16_ = auVar34;
        auVar31 = vshufps_avx(auVar30,auVar30,0);
        auVar64._16_16_ = auVar31;
        auVar64._0_16_ = auVar31;
        lVar14 = 0;
        for (iVar20 = 0; iVar20 + 7 < iVar4; iVar20 = iVar20 + 8) {
          auVar33 = vfmadd132ps_fma(*pauVar25,auVar64,auVar60);
          *pauVar25 = ZEXT1632(auVar33);
          pauVar25 = pauVar25 + 1;
          lVar14 = lVar14 + 8;
        }
        for (; iVar20 + 3 < iVar4; iVar20 = iVar20 + 4) {
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar31,auVar34);
          *(undefined1 (*) [16])*pauVar25 = auVar33;
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          lVar14 = lVar14 + 4;
        }
        for (; (int)lVar14 < iVar4; lVar14 = lVar14 + 1) {
          auVar34 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar2 + lVar14 * 4 + lVar18)),auVar30,
                                    ZEXT416((uint)fVar38));
          *(int *)((long)pvVar2 + lVar14 * 4 + lVar18) = auVar34._0_4_;
        }
      }
      else {
        auVar31 = vshufps_avx(ZEXT416((uint)fVar38),auVar34,0);
        auVar33 = vshufps_avx(auVar30,auVar30,0);
        auVar63._16_16_ = auVar33;
        auVar63._0_16_ = auVar33;
        lVar23 = *(long *)(&this->field_0x128 + (long)p_Var21) +
                 *(long *)(&this->field_0x138 + (long)p_Var21) * lVar6;
        lVar14 = *(long *)(&this->field_0xe0 + (long)p_Var21) +
                 *(long *)(&this->field_0xf0 + (long)p_Var21) * lVar6;
        lVar15 = 0;
        lVar19 = 0;
        iVar20 = 0;
        while( true ) {
          fVar37 = auVar31._0_4_;
          fVar38 = auVar31._4_4_;
          fVar26 = auVar31._8_4_;
          if (iVar4 <= iVar20 + 7) break;
          auVar56 = *(undefined1 (*) [32])(lVar14 + lVar19);
          auVar35._0_4_ = auVar56._0_4_ * fVar37;
          auVar35._4_4_ = auVar56._4_4_ * fVar38;
          auVar35._8_4_ = auVar56._8_4_ * fVar26;
          auVar35._12_4_ = auVar56._12_4_ * auVar31._12_4_;
          auVar35._16_4_ = auVar56._16_4_ * fVar37;
          auVar35._20_4_ = auVar56._20_4_ * fVar38;
          auVar35._28_36_ = in_ZMM11._28_36_;
          auVar35._24_4_ = auVar56._24_4_ * fVar26;
          in_ZMM11 = ZEXT3264(auVar35._0_32_);
          auVar51 = vfmadd213ps_fma(auVar56,auVar63,*(undefined1 (*) [32])(lVar23 + lVar19));
          auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar35._0_32_,
                                    *(undefined1 (*) [32])((long)pvVar2 + lVar19 + lVar18));
          *(undefined1 (*) [32])((long)pvVar2 + lVar19 + lVar18) = ZEXT1632(auVar51);
          iVar20 = iVar20 + 8;
          lVar19 = lVar19 + 0x20;
          lVar15 = lVar15 + 8;
        }
        for (; iVar20 + 3 < iVar4; iVar20 = iVar20 + 4) {
          auVar51 = *(undefined1 (*) [16])(lVar14 + lVar19);
          auVar62._0_4_ = auVar51._0_4_ * fVar37;
          auVar62._4_4_ = auVar51._4_4_ * fVar38;
          auVar62._8_4_ = auVar51._8_4_ * fVar26;
          auVar62._12_4_ = auVar51._12_4_ * auVar31._12_4_;
          auVar51 = vfmadd213ps_fma(auVar51,auVar33,*(undefined1 (*) [16])(lVar23 + lVar19));
          auVar51 = vfmadd231ps_fma(auVar51,auVar62,
                                    *(undefined1 (*) [16])((long)pvVar2 + lVar19 + lVar18));
          *(undefined1 (*) [16])((long)pvVar2 + lVar19 + lVar18) = auVar51;
          lVar19 = lVar19 + 0x10;
          lVar15 = lVar15 + 4;
        }
        for (; (int)lVar15 < iVar4; lVar15 = lVar15 + 1) {
          auVar31 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar2 + lVar15 * 4 + lVar18)),auVar30,
                                    auVar34);
          auVar31 = vfmadd213ss_fma(auVar31,ZEXT416(*(uint *)(lVar14 + lVar15 * 4)),
                                    ZEXT416(*(uint *)(lVar23 + lVar15 * 4)));
          *(int *)((long)pvVar2 + lVar15 * 4 + lVar18) = auVar31._0_4_;
        }
      }
      p_Var21 = pp_Var1[-3];
      iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var21);
      lVar6 = lVar6 + lVar5;
    }
  }
  else if (iVar20 - 3U < 2) {
    iVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar24 = 0;
    uVar8 = uVar8 & 0xffffffff;
    if (iVar4 < 1) {
      uVar8 = uVar24;
    }
    fVar37 = 1.0 / (float)(iVar20 * iVar4);
    for (; (long)uVar24 < (long)iVar13; uVar24 = uVar24 + 1) {
      lVar6 = uVar24 * lVar5;
      uVar7 = bottom_top_blob->elemsize;
      lVar14 = bottom_top_blob->cstep * lVar6 * uVar7;
      pvVar2 = bottom_top_blob->data;
      uVar17 = (long)bottom_top_blob->d * uVar7 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar10 = uVar17 - uVar17 % uVar7;
      fVar38 = 0.0;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pfVar11 = (float *)((long)pvVar2 + lVar10 * uVar7 + lVar14);
        fVar26 = 0.0;
        fVar36 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        for (iVar13 = 0; iVar13 + 7 < iVar20; iVar13 = iVar13 + 8) {
          fVar26 = fVar26 + *pfVar11;
          fVar36 = fVar36 + pfVar11[1];
          fVar39 = fVar39 + pfVar11[2];
          fVar40 = fVar40 + pfVar11[3];
          fVar41 = fVar41 + pfVar11[4];
          fVar42 = fVar42 + pfVar11[5];
          fVar47 = fVar47 + pfVar11[6];
          fVar48 = fVar48 + pfVar11[7];
          pfVar11 = pfVar11 + 8;
        }
        auVar45._0_4_ = fVar41 + fVar26;
        auVar45._4_4_ = fVar42 + fVar36;
        auVar45._8_4_ = fVar47 + fVar39;
        auVar45._12_4_ = fVar48 + fVar40;
        auVar34 = vshufpd_avx(auVar45,auVar45,1);
        auVar46._0_4_ = auVar34._0_4_ + auVar45._0_4_;
        auVar46._4_4_ = auVar34._4_4_ + auVar45._4_4_;
        auVar46._8_4_ = auVar34._8_4_ + auVar45._8_4_;
        auVar46._12_4_ = auVar34._12_4_ + auVar45._12_4_;
        auVar34 = vmovshdup_avx(auVar46);
        auVar53 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar26 = auVar53._4_4_;
          fVar36 = auVar53._8_4_;
          fVar39 = auVar53._12_4_;
          if (iVar20 <= iVar13 + 3) break;
          auVar53._0_4_ = auVar53._0_4_ + *pfVar11;
          auVar53._4_4_ = fVar26 + pfVar11[1];
          auVar53._8_4_ = fVar36 + pfVar11[2];
          auVar53._12_4_ = fVar39 + pfVar11[3];
          pfVar11 = pfVar11 + 4;
          iVar13 = iVar13 + 4;
        }
        auVar30 = vshufpd_avx(auVar53,auVar53,1);
        auVar54._0_4_ = auVar30._0_4_ + auVar53._0_4_;
        auVar54._4_4_ = auVar30._4_4_ + fVar26;
        auVar54._8_4_ = auVar30._8_4_ + fVar36;
        auVar54._12_4_ = auVar30._12_4_ + fVar39;
        auVar30 = vmovshdup_avx(auVar54);
        fVar38 = auVar34._0_4_ + fVar38 + auVar46._0_4_ + auVar30._0_4_ + auVar54._0_4_;
        for (; iVar13 < iVar20; iVar13 = iVar13 + 1) {
          fVar38 = fVar38 + *pfVar11;
          pfVar11 = pfVar11 + 1;
        }
      }
      pfVar11 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var21) +
                         *(long *)(&this->field_0xf0 + (long)p_Var21) * lVar6);
      fVar38 = fVar38 * fVar37;
      auVar34 = vshufps_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),0);
      auVar57._16_16_ = auVar34;
      auVar57._0_16_ = auVar34;
      auVar35 = ZEXT864(0);
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pauVar12 = (undefined1 (*) [32])((long)pvVar2 + lVar10 * uVar7 + lVar14);
        auVar30 = ZEXT816(0) << 0x40;
        for (iVar13 = 0; iVar13 + 7 < iVar20; iVar13 = iVar13 + 8) {
          auVar56 = vsubps_avx(*pauVar12,auVar57);
          auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar56,auVar56);
          pauVar12 = pauVar12 + 1;
        }
        auVar58._0_4_ = auVar30._0_4_ + 0.0;
        auVar58._4_4_ = auVar30._4_4_ + 0.0;
        auVar58._8_4_ = auVar30._8_4_ + 0.0;
        auVar58._12_4_ = auVar30._12_4_ + 0.0;
        auVar30 = vshufpd_avx(auVar58,auVar58,1);
        auVar59._0_4_ = auVar30._0_4_ + auVar58._0_4_;
        auVar59._4_4_ = auVar30._4_4_ + auVar58._4_4_;
        auVar59._8_4_ = auVar30._8_4_ + auVar58._8_4_;
        auVar59._12_4_ = auVar30._12_4_ + auVar58._12_4_;
        auVar30 = vmovshdup_avx(auVar59);
        auVar31 = ZEXT816(0) << 0x40;
        for (; iVar13 + 3 < iVar20; iVar13 = iVar13 + 4) {
          auVar33 = vsubps_avx(*(undefined1 (*) [16])*pauVar12,auVar34);
          auVar31 = vfmadd231ps_fma(auVar31,auVar33,auVar33);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        }
        auVar33 = vshufpd_avx(auVar31,auVar31,1);
        auVar66._0_4_ = auVar33._0_4_ + auVar31._0_4_;
        auVar66._4_4_ = auVar33._4_4_ + auVar31._4_4_;
        auVar66._8_4_ = auVar33._8_4_ + auVar31._8_4_;
        auVar66._12_4_ = auVar33._12_4_ + auVar31._12_4_;
        auVar31 = vmovshdup_avx(auVar66);
        auVar35 = ZEXT464((uint)(auVar31._0_4_ + auVar66._0_4_ +
                                auVar59._0_4_ + auVar30._0_4_ + auVar35._0_4_));
        for (; iVar13 < iVar20; iVar13 = iVar13 + 1) {
          auVar30 = ZEXT416((uint)(*(float *)*pauVar12 - fVar38));
          auVar30 = vfmadd231ss_fma(auVar35._0_16_,auVar30,auVar30);
          auVar35 = ZEXT1664(auVar30);
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
        }
      }
      puVar22 = (uint *)(*(long *)(&this->field_0x128 + (long)p_Var21) +
                        lVar6 * *(long *)(&this->field_0x138 + (long)p_Var21));
      auVar30 = vfmadd213ss_fma(auVar35._0_16_,ZEXT416((uint)fVar37),
                                ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var21)));
      auVar34 = vrsqrtss_avx(auVar30,auVar30);
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)(auVar30._0_4_ * auVar34._0_4_)),auVar34,
                                SUB6416(ZEXT464(0xc0400000),0));
      fVar26 = auVar34._0_4_ * -0.5 * auVar30._0_4_;
      pp_Var3 = this->_vptr_GroupNorm_x86_fma;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        auVar34 = ZEXT416((uint)(fVar26 * -fVar38));
        fVar36 = fVar26;
        if (*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) != 0) {
          fVar36 = *pfVar11 * fVar26;
          auVar34 = vfmadd213ss_fma(ZEXT416((uint)*pfVar11),auVar34,ZEXT416(*puVar22));
        }
        pauVar12 = (undefined1 (*) [32])((long)pvVar2 + lVar10 * uVar7 + lVar14);
        auVar33 = ZEXT416((uint)fVar36);
        auVar30 = vshufps_avx(auVar33,auVar33,0);
        auVar68._16_16_ = auVar30;
        auVar68._0_16_ = auVar30;
        auVar31 = vshufps_avx(auVar34,auVar34,0);
        auVar70._16_16_ = auVar31;
        auVar70._0_16_ = auVar31;
        for (iVar13 = 0; iVar13 + 7 < iVar20; iVar13 = iVar13 + 8) {
          auVar51 = vfmadd132ps_fma(*pauVar12,auVar70,auVar68);
          *pauVar12 = ZEXT1632(auVar51);
          pauVar12 = pauVar12 + 1;
        }
        for (; iVar13 + 3 < iVar20; iVar13 = iVar13 + 4) {
          auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar12,auVar31,auVar30);
          *(undefined1 (*) [16])*pauVar12 = auVar51;
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        }
        for (; iVar13 < iVar20; iVar13 = iVar13 + 1) {
          auVar30 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar12),auVar34,auVar33);
          *(int *)*pauVar12 = auVar30._0_4_;
          pauVar12 = (undefined1 (*) [32])(*pauVar12 + 4);
        }
        pfVar11 = pfVar11 + 1;
        puVar22 = puVar22 + 1;
      }
      p_Var21 = pp_Var1[-3];
      iVar13 = *(int *)(&this->field_0xd0 + (long)p_Var21);
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}